

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O3

bool __thiscall basisu::basis_compressor::validate_ktx2_constraints(basis_compressor *this)

{
  basisu_backend_slice_desc *pbVar1;
  ulong uVar2;
  long lVar3;
  uint min_new_capacity;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  vector<unsigned_int> total_mips;
  elemental_vector local_28;
  
  uVar2 = (ulong)(this->m_slice_descs).m_size;
  if (uVar2 == 0) {
    local_28.m_p = (int *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
  }
  else {
    pbVar1 = (this->m_slice_descs).m_p;
    lVar3 = 0;
    min_new_capacity = 0;
    iVar4 = 0;
    iVar6 = 0;
    do {
      if (*(int *)((long)&pbVar1->m_mip_index + lVar3) == 0) {
        iVar7 = *(int *)((long)&pbVar1->m_orig_width + lVar3);
        if (iVar6 == 0) {
          iVar4 = *(int *)((long)&pbVar1->m_orig_height + lVar3);
        }
        else if ((iVar7 != iVar6) ||
                (iVar7 = iVar6, *(int *)((long)&pbVar1->m_orig_height + lVar3) != iVar4)) {
          return false;
        }
        uVar8 = *(int *)((long)&pbVar1->m_source_file_index + lVar3) + 1;
        iVar6 = iVar7;
        if (min_new_capacity <= uVar8) {
          min_new_capacity = uVar8;
        }
      }
      lVar3 = lVar3 + 0x30;
    } while (uVar2 * 0x30 != lVar3);
    local_28.m_p = (int *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
    if (min_new_capacity == 0) {
      min_new_capacity = 0;
      bVar9 = false;
    }
    else {
      elemental_vector::increase_capacity
                (&local_28,min_new_capacity,min_new_capacity == 1,4,(object_mover)0x0,false);
      memset((int *)((long)local_28.m_p + (local_28._8_8_ & 0xffffffff) * 4),0,
             (ulong)(min_new_capacity - local_28.m_size) << 2);
      local_28.m_size = min_new_capacity;
      bVar9 = (this->m_slice_descs).m_size == 0;
    }
    if (!bVar9) {
      lVar3 = 0x28;
      uVar2 = 0;
      do {
        pbVar1 = (this->m_slice_descs).m_p;
        uVar8 = *(uint *)((long)pbVar1 + lVar3 + -4);
        if (local_28.m_size <= uVar8) goto LAB_002132e8;
        uVar5 = *(int *)((long)&pbVar1->m_first_block_index + lVar3) + 1;
        if (uVar5 < *(uint *)((long)local_28.m_p + (ulong)uVar8 * 4)) {
          uVar5 = *(uint *)((long)local_28.m_p + (ulong)uVar8 * 4);
        }
        *(uint *)((long)local_28.m_p + (ulong)uVar8 * 4) = uVar5;
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x30;
      } while (uVar2 < (this->m_slice_descs).m_size);
    }
    if (1 < min_new_capacity) {
      if ((local_28._8_8_ & 0xffffffff) == 0) {
LAB_002132e8:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,
                      "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]");
      }
      bVar9 = false;
      uVar2 = 2;
      do {
        if ((1 - (local_28._8_8_ & 0xffffffff)) + uVar2 == 2) goto LAB_002132e8;
        if (*local_28.m_p != *(int *)((long)local_28.m_p + (uVar2 - 1) * 4)) break;
        bVar9 = min_new_capacity <= uVar2;
        bVar10 = uVar2 != min_new_capacity;
        uVar2 = uVar2 + 1;
      } while (bVar10);
      goto LAB_002132d5;
    }
  }
  bVar9 = true;
  if ((int *)local_28.m_p == (int *)0x0) {
    return true;
  }
LAB_002132d5:
  free(local_28.m_p);
  return bVar9;
}

Assistant:

bool basis_compressor::validate_ktx2_constraints()
	{
		uint32_t base_width = 0, base_height = 0;
		uint32_t total_layers = 0;
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
		{
			if (m_slice_descs[i].m_mip_index == 0)
			{
				if (!base_width)
				{
					base_width = m_slice_descs[i].m_orig_width;
					base_height = m_slice_descs[i].m_orig_height;
				}
				else
				{
					if ((m_slice_descs[i].m_orig_width != base_width) || (m_slice_descs[i].m_orig_height != base_height))
					{
						return false;
					}
				}

				total_layers = maximum<uint32_t>(total_layers, m_slice_descs[i].m_source_file_index + 1);
			}
		}

		basisu::vector<uint32_t> total_mips(total_layers);
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
			total_mips[m_slice_descs[i].m_source_file_index] = maximum<uint32_t>(total_mips[m_slice_descs[i].m_source_file_index], m_slice_descs[i].m_mip_index + 1);

		for (uint32_t i = 1; i < total_layers; i++)
		{
			if (total_mips[0] != total_mips[i])
			{
				return false;
			}
		}

		return true;
	}